

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_rangeproof_info
              (secp256k1_context *ctx,int *exp,int *mantissa,uint64_t *min_value,uint64_t *max_value
              ,uchar *proof,size_t plen)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint64_t uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  
  if (exp == (int *)0x0) {
    secp256k1_rangeproof_info_cold_5();
  }
  else if (mantissa == (int *)0x0) {
    secp256k1_rangeproof_info_cold_4();
  }
  else if (min_value == (uint64_t *)0x0) {
    secp256k1_rangeproof_info_cold_3();
  }
  else if (max_value == (uint64_t *)0x0) {
    secp256k1_rangeproof_info_cold_2();
  }
  else {
    if (proof != (uchar *)0x0) {
      if (plen < 0x41) {
        return 0;
      }
      bVar1 = *proof;
      if ((char)bVar1 < '\0') {
        return 0;
      }
      *exp = -1;
      *mantissa = 0;
      if (bVar1 < 0x40) {
        lVar3 = 1;
        uVar7 = 0;
      }
      else {
        bVar2 = *proof;
        *exp = bVar2 & 0x1f;
        if (0x12 < (byte)(bVar2 & 0x1f)) {
          return 0;
        }
        bVar2 = proof[1];
        *mantissa = bVar2 + 1;
        if (0x3f < bVar2) {
          return 0;
        }
        uVar7 = 0xffffffffffffffff >> (~bVar2 & 0x3f);
        lVar3 = 2;
      }
      *max_value = uVar7;
      iVar5 = *exp;
      if (0 < iVar5) {
        uVar7 = *max_value;
        do {
          if (0x1999999999999999 < uVar7) {
            return 0;
          }
          uVar7 = uVar7 * 10;
          *max_value = uVar7;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      *min_value = 0;
      if ((bVar1 & 0x20) != 0) {
        if (plen - lVar3 < 8) {
          return 0;
        }
        uVar4 = *min_value;
        lVar6 = 0;
        do {
          uVar4 = uVar4 << 8 | (ulong)proof[lVar6 + lVar3];
          *min_value = uVar4;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 8);
      }
      if (CARRY8(*max_value,*min_value)) {
        return 0;
      }
      *max_value = *max_value + *min_value;
      return 1;
    }
    secp256k1_rangeproof_info_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_rangeproof_info(const secp256k1_context* ctx, int *exp, int *mantissa,
 uint64_t *min_value, uint64_t *max_value, const unsigned char *proof, size_t plen) {
    size_t offset;
    uint64_t scale;
    ARG_CHECK(exp != NULL);
    ARG_CHECK(mantissa != NULL);
    ARG_CHECK(min_value != NULL);
    ARG_CHECK(max_value != NULL);
    ARG_CHECK(proof != NULL);
    offset = 0;
    scale = 1;
    (void)ctx;
    return secp256k1_rangeproof_getheader_impl(&offset, exp, mantissa, &scale, min_value, max_value, proof, plen);
}